

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

FILE * ly_out_file(ly_out *out,FILE *f)

{
  FILE *prev_f;
  FILE *f_local;
  ly_out *out_local;
  
  if (out == (ly_out *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out","ly_out_file");
    out_local = (ly_out *)0x0;
  }
  else if (out->type == LY_OUT_FILE) {
    out_local = (ly_out *)(out->method).f;
    if (f != (FILE *)0x0) {
      (out->method).f = f;
    }
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out->type == LY_OUT_FILE"
           ,"ly_out_file");
    out_local = (ly_out *)0x0;
  }
  return (FILE *)out_local;
}

Assistant:

LIBYANG_API_DEF FILE *
ly_out_file(struct ly_out *out, FILE *f)
{
    FILE *prev_f;

    LY_CHECK_ARG_RET(NULL, out, out->type == LY_OUT_FILE, NULL);

    prev_f = out->method.f;

    if (f) {
        out->method.f = f;
    }

    return prev_f;
}